

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre.cc
# Opt level: O0

bool re2::PCRE::Arg::parse_int_radix(char *str,int n,void *dest,int radix)

{
  bool bVar1;
  long local_38;
  long r;
  int *piStack_28;
  int radix_local;
  void *dest_local;
  char *pcStack_18;
  int n_local;
  char *str_local;
  
  r._4_4_ = radix;
  piStack_28 = (int *)dest;
  dest_local._4_4_ = n;
  pcStack_18 = str;
  bVar1 = parse_long_radix(str,n,&local_38,radix);
  if (bVar1) {
    if ((int)local_38 == local_38) {
      if (piStack_28 == (int *)0x0) {
        str_local._7_1_ = true;
      }
      else {
        *piStack_28 = (int)local_38;
        str_local._7_1_ = true;
      }
    }
    else {
      str_local._7_1_ = false;
    }
  }
  else {
    str_local._7_1_ = false;
  }
  return str_local._7_1_;
}

Assistant:

bool PCRE::Arg::parse_int_radix(const char* str,
                              int n,
                              void* dest,
                              int radix) {
  long r;
  if (!parse_long_radix(str, n, &r, radix)) return false; // Could not parse
  if ((int)r != r) return false;         // Out of range
  if (dest == NULL) return true;
  *(reinterpret_cast<int*>(dest)) = r;
  return true;
}